

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_winograd.h
# Opt level: O1

void ncnn::conv3x3s1_winograd23_transform_kernel(Mat *kernel,Mat *AT,int inch,int outch,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  void *pvVar4;
  float fVar5;
  uint uVar6;
  undefined1 auVar7 [16];
  int *piVar8;
  undefined1 auVar9 [12];
  int iVar10;
  _func_int ***ppp_Var11;
  int iVar12;
  int iVar13;
  float *pfVar14;
  long lVar15;
  uint uVar16;
  ulong uVar17;
  int kk;
  ulong uVar18;
  undefined1 auVar19 [16];
  int TILE_K;
  int TILE_M;
  Mat m;
  int TILE_N;
  uint local_168;
  uint local_164;
  uint local_160;
  uint local_15c;
  uint local_158;
  uint local_154;
  undefined8 local_150;
  undefined1 local_148 [12];
  float fStack_13c;
  size_t local_138;
  float local_130 [2];
  undefined8 local_128;
  float local_120;
  int iStack_11c;
  int iStack_118;
  float fStack_114;
  int iStack_110;
  size_t local_108;
  Mat local_f8;
  undefined1 local_a8 [48];
  int iStack_78;
  undefined4 uStack_74;
  int local_70;
  size_t local_68;
  ulong local_58;
  ulong local_50;
  Mat *local_48;
  Mat *local_40;
  int local_34;
  
  local_48 = kernel;
  get_optimal_tile_mnk(outch,0,inch,(int *)&local_164,&local_34,(int *)&local_168,opt->num_threads);
  uVar6 = local_168;
  uVar16 = (int)(outch + local_164 + -1) / (int)local_164;
  iVar12 = local_164 * local_168;
  local_f8.cstep = 0;
  local_f8.data = (Allocator *)0x0;
  local_f8.refcount._0_4_ = 0;
  local_f8.refcount._4_4_ = 0;
  local_f8.elemsize._0_4_ = 0;
  local_f8.elempack = 0;
  local_f8.elemsize._4_4_ = (int)local_f8.refcount;
  local_f8.allocator = (Allocator *)local_f8.data;
  local_f8.dims = (int)local_f8.refcount;
  local_f8.w = local_f8.refcount._4_4_;
  local_f8.h = (int)local_f8.elemsize;
  local_f8.d = (int)local_f8.refcount;
  local_f8.c = local_f8.elempack;
  local_58 = (ulong)(uint)outch;
  Mat::create(&local_f8,iVar12 * 0x10,1,opt->num_threads,4,(Allocator *)0x0);
  local_150 = (ulong)(uint)inch;
  local_40 = AT;
  Mat::create(AT,iVar12,0x10,(int)(inch + uVar6 + -1) / (int)uVar6,uVar16,4,(Allocator *)0x0);
  if (0 < (int)uVar16) {
    iVar12 = (int)local_150;
    uVar18 = 0;
    uVar17 = local_150;
    local_160 = uVar16;
    do {
      iVar13 = local_164 * (int)uVar18;
      local_50 = uVar18;
      iVar10 = get_omp_thread_num();
      local_a8._16_8_ = CONCAT44(local_f8.elemsize._4_4_,(int)local_f8.elemsize);
      local_a8._0_8_ =
           (_func_int ***)
           ((long)(_func_int ***)local_f8.data + (long)iVar10 * local_f8.cstep * local_a8._16_8_);
      local_a8._8_4_ = 0;
      local_a8._12_4_ = 0;
      local_a8._24_4_ = local_f8.elempack;
      local_a8._32_8_ = local_f8.allocator;
      auVar9._4_4_ = iStack_78;
      auVar9._8_4_ = uStack_74;
      auVar9._0_4_ = local_f8.w;
      local_a8._40_8_ = auVar9._0_8_ << 0x20;
      iStack_78 = local_f8.h;
      uStack_74 = 1;
      local_70 = local_f8.d;
      local_68 = (local_a8._16_8_ * (long)local_f8.h * (long)local_f8.w + 0xfU & 0xfffffffffffffff0)
                 / (ulong)local_a8._16_8_;
      local_a8._40_4_ = local_f8.dims + -1;
      if (local_f8.dims == 4) {
        local_68 = (long)local_f8.h * (long)local_f8.w;
      }
      if (0 < (int)uVar17) {
        local_15c = (int)local_58 - iVar13;
        iVar10 = 0;
        do {
          local_158 = local_164;
          uVar6 = local_15c;
          if ((int)local_164 < (int)local_15c) {
            uVar6 = local_164;
          }
          uVar16 = (int)uVar17 - iVar10;
          local_154 = local_168;
          if ((int)local_168 < (int)uVar16) {
            uVar16 = local_168;
          }
          if (0 < (int)uVar6) {
            pvVar4 = local_48->data;
            uVar17 = 0;
            ppp_Var11 = (_func_int ***)local_a8._0_8_;
            do {
              if (0 < (int)uVar16) {
                uVar18 = 0;
                do {
                  pfVar14 = (float *)((long)pvVar4 +
                                     (uVar18 + (long)iVar10) * 0x24 +
                                     (long)(((int)uVar17 + iVar13) * iVar12 * 9) * 4);
                  lVar15 = 0;
                  do {
                    fVar1 = *pfVar14;
                    fVar2 = pfVar14[2];
                    fVar3 = pfVar14[1];
                    *(float *)(local_148 + lVar15 * 4) = fVar1;
                    fVar1 = fVar1 * 0.5;
                    fVar5 = fVar2 * 0.5;
                    (&fStack_13c)[lVar15] = fVar3 * 0.5 + fVar1 + fVar5;
                    local_130[lVar15] = (fVar1 - fVar3 * 0.5) + fVar5;
                    *(float *)((long)&local_128 + lVar15 * 4 + 4) = fVar2;
                    pfVar14 = pfVar14 + 3;
                    lVar15 = lVar15 + 1;
                  } while (lVar15 != 3);
                  lVar15 = 8;
                  do {
                    fVar1 = *(float *)(local_148 + lVar15);
                    fVar2 = *(float *)((long)&local_150 + lVar15) * 0.5;
                    fVar3 = *(float *)((long)&local_150 + lVar15 + 4) * 0.5;
                    fVar5 = fVar1 * 0.5;
                    *(float *)ppp_Var11 = *(float *)((long)&local_150 + lVar15);
                    *(float *)((long)ppp_Var11 + 4) = fVar3 + fVar2 + fVar5;
                    *(float *)(ppp_Var11 + 1) = (fVar2 - fVar3) + fVar5;
                    *(float *)((long)(ppp_Var11 + 1) + 4) = fVar1;
                    ppp_Var11 = ppp_Var11 + 2;
                    lVar15 = lVar15 + 0xc;
                  } while (lVar15 != 0x38);
                  uVar18 = uVar18 + 1;
                } while (uVar18 != uVar16);
              }
              uVar17 = uVar17 + 1;
            } while (uVar17 != uVar6);
          }
          iStack_11c = local_40->w;
          local_138 = local_40->elemsize;
          iStack_118 = local_40->h;
          local_130[0] = (float)local_40->elempack;
          local_128 = local_40->allocator;
          local_108 = (long)iStack_118 * (long)iStack_11c;
          local_148._0_8_ =
               (long)local_40->data +
               local_138 * local_108 * (long)(iVar10 / (int)local_168) +
               (long)(iVar13 / (int)local_164) * local_40->cstep * local_138;
          local_148._8_4_ = 0;
          fStack_13c = 0.0;
          local_120 = 2.8026e-45;
          fStack_114 = 1.4013e-45;
          iStack_110 = 1;
          pack_A_tile((Mat *)local_a8,(Mat *)local_148,0x10,uVar6,uVar16);
          uVar17 = local_150;
          piVar8 = (int *)CONCAT44(fStack_13c,local_148._8_4_);
          if (piVar8 != (int *)0x0) {
            LOCK();
            *piVar8 = *piVar8 + -1;
            UNLOCK();
            if (*piVar8 == 0) {
              if (local_128 == (Allocator *)0x0) {
                if ((void *)local_148._0_8_ != (void *)0x0) {
                  free((void *)local_148._0_8_);
                }
              }
              else {
                (*local_128->_vptr_Allocator[3])();
              }
            }
          }
          local_108 = 0;
          auVar7 = ZEXT816(0);
          auVar19 = auVar7 << 0x40;
          local_148._0_8_ = auVar19._0_8_;
          local_148._0_8_ = (void *)0x0;
          local_148._8_4_ = auVar7._0_4_;
          local_148._8_4_ = 0;
          fStack_13c = auVar19._0_4_;
          fStack_13c = 0.0;
          local_138 = auVar19._4_8_;
          local_130[0] = auVar7._4_4_;
          local_130[0] = 0.0;
          iStack_11c = auVar19._4_4_;
          iStack_11c = 0;
          iStack_110 = 0;
          iVar10 = iVar10 + local_168;
          local_120 = fStack_13c;
          iStack_118 = local_148._8_4_;
          fStack_114 = local_130[0];
        } while (iVar10 < (int)uVar17);
      }
      uVar6 = local_160;
      piVar8 = (int *)CONCAT44(local_a8._12_4_,local_a8._8_4_);
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + -1;
        UNLOCK();
        if (*piVar8 == 0) {
          if ((Allocator *)local_a8._32_8_ == (Allocator *)0x0) {
            if ((_func_int ***)local_a8._0_8_ != (_func_int ***)0x0) {
              free((void *)local_a8._0_8_);
            }
          }
          else {
            (*(*(_func_int ***)local_a8._32_8_)[3])();
          }
        }
      }
      local_68 = 0;
      register0x00001200 = ZEXT816(0) << 0x40;
      local_a8._0_8_ = (void *)0x0;
      local_a8._8_4_ = 0;
      local_a8._12_4_ = 0;
      local_a8._16_8_ = local_a8._44_8_;
      local_a8._24_4_ = 0;
      local_70 = 0;
      uVar16 = (int)local_50 + 1;
      uVar18 = (ulong)uVar16;
    } while (uVar16 != uVar6);
  }
  piVar8 = (int *)CONCAT44(local_f8.refcount._4_4_,(int)local_f8.refcount);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if (local_f8.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_f8.data != (Allocator *)0x0) {
          free(local_f8.data);
        }
      }
      else {
        (*(local_f8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd23_transform_kernel(const Mat& kernel, Mat& AT, int inch, int outch, const Option& opt)
{
    const int M = outch;
    const int K = inch;
    const int B = 16;

    int TILE_M, TILE_N, TILE_K;
    get_optimal_tile_mnk(M, 0, K, TILE_M, TILE_N, TILE_K, opt.num_threads);

    const int nn_M = (M + TILE_M - 1) / TILE_M;

    Mat A_tileX(B * TILE_M * TILE_K, 1, opt.num_threads, 4u, (Allocator*)0);

    AT.create(TILE_K * TILE_M, B, (K + TILE_K - 1) / TILE_K, (M + TILE_M - 1) / TILE_M, 4u, (Allocator*)0);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int ppj = 0; ppj < nn_M; ppj++)
    {
        const int i = ppj * TILE_M;

        Mat A_tile = A_tileX.channel(get_omp_thread_num());

        for (int k = 0; k < K; k += TILE_K)
        {
            const int max_ii = std::min((M - i), TILE_M);
            const int max_kk = std::min((K - k), TILE_K);

            conv3x3s1_winograd23_transform_kernel_tile(kernel, A_tile, inch, i, max_ii, k, max_kk);

            Mat AT_tile = AT.channel(i / TILE_M).depth(k / TILE_K);

            pack_A_tile(A_tile, AT_tile, B, max_ii, max_kk);
        }
    }
}